

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::args::SsboArgs::setSingleValue
          (SsboArgs *this,SsboArgData *argData)

{
  bool bVar1;
  MessageBuilder *this_00;
  MessageBuilder local_1c8;
  undefined4 local_48;
  undefined1 local_38 [8];
  string message;
  SsboArgData *argData_local;
  SsboArgs *this_local;
  
  message.field_2._8_8_ = argData;
  std::__cxx11::string::string((string *)local_38);
  switch(argData->member) {
  case ARGMEMBER_FORMAT:
    std::__cxx11::string::operator=((string *)&this->m_stdFormat,(string *)&argData->data);
    local_48 = 1;
    break;
  case ARGMEMBER_BINDING_POINT:
    std::__cxx11::string::operator=((string *)&this->m_bindingPoint,(string *)&argData->data);
    local_48 = 1;
    break;
  case ARGMEMBER_MATRIX_ORDER:
    std::__cxx11::string::operator=((string *)&this->m_matrixOrder,(string *)&argData->data);
    local_48 = 1;
    break;
  case ARGMEMBER_MEMBER_TYPE:
    std::__cxx11::string::operator=((string *)&this->m_memberType,(string *)&argData->data);
    local_48 = 1;
    break;
  case ARGMEMBER_NAME:
    std::__cxx11::string::operator=((string *)&this->m_memberName,(string *)&argData->data);
    local_48 = 1;
    break;
  case ARGMEMBER_FIXED_ARRAY:
    std::__cxx11::string::operator=
              ((string *)&this->m_memberFixedArrayerName,(string *)&argData->data);
    local_48 = 1;
    break;
  case ARGMEMBER_VARIABLE_ARRAY:
    std::__cxx11::string::operator=((string *)&this->m_memberVariableArray,(string *)&argData->data)
    ;
    local_48 = 1;
    break;
  case ARGMEMBER_REORDER:
    bVar1 = std::operator==(&argData->data,"true");
    if (bVar1) {
      this->m_memberReorder = true;
    }
    local_48 = 1;
    break;
  default:
    std::__cxx11::string::operator=
              ((string *)local_38,"auto loop argument data member not recognised.");
    tcu::TestLog::operator<<(&local_1c8,this->m_testLog,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    local_48 = 0;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void SsboArgs::setSingleValue (const SsboArgData argData)
{
	std::string message;

	switch (argData.member)
	{
		case ARGMEMBER_FORMAT:
			m_stdFormat					=	argData.data;
			return;
		case ARGMEMBER_BINDING_POINT:
			m_bindingPoint				=	argData.data;
			return;
		case ARGMEMBER_MATRIX_ORDER:
			m_matrixOrder				=	argData.data;
			return;
		case ARGMEMBER_MEMBER_TYPE:
			m_memberType				=	argData.data;
			return;
		case ARGMEMBER_NAME:
			m_memberName				=	argData.data;
			return;
		case ARGMEMBER_FIXED_ARRAY:
			m_memberFixedArrayerName	=	argData.data;
			return;
		case ARGMEMBER_VARIABLE_ARRAY:
			m_memberVariableArray		=	argData.data;
			return;
		case ARGMEMBER_REORDER:
			if (argData.data == "true")
			{
				m_memberReorder			=	true;
			}
			return;
		default:
			message = "auto loop argument data member not recognised.";
			m_testLog << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
	}
}